

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::columnCountChanged(QTreeView *this,int oldCount,int newCount)

{
  bool bVar1;
  QTreeViewPrivate *pQVar2;
  uint in_EDX;
  int in_ESI;
  QAbstractScrollArea *in_RDI;
  QTreeViewPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QTreeView *)0x8ef284);
  if ((in_ESI == 0) && (0 < (int)in_EDX)) {
    QAbstractItemViewPrivate::doDelayedItemsLayout
              ((QAbstractItemViewPrivate *)(ulong)in_EDX,(int)((ulong)pQVar2 >> 0x20));
  }
  bVar1 = QWidget::isVisible((QWidget *)0x8ef2ad);
  if (bVar1) {
    (**(code **)(*(long *)&(in_RDI->super_QFrame).super_QWidget + 0x268))();
  }
  QAbstractScrollArea::viewport(in_RDI);
  QWidget::update(in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QTreeView::columnCountChanged(int oldCount, int newCount)
{
    Q_D(QTreeView);
    if (oldCount == 0 && newCount > 0) {
        //if the first column has just been added we need to relayout.
        d->doDelayedItemsLayout();
    }

    if (isVisible())
        updateGeometries();
    viewport()->update();
}